

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatClause.c
# Opt level: O0

void Msat_ClauseFree(Msat_Solver_t *p,Msat_Clause_t *pC,int fRemoveWatched)

{
  Msat_ClauseVec_t **ppMVar1;
  Msat_MmStep_t *p_00;
  Msat_ClauseVec_t **pvWatched;
  Msat_Lit_t Lit;
  int fRemoveWatched_local;
  Msat_Clause_t *pC_local;
  Msat_Solver_t *p_local;
  
  if (fRemoveWatched != 0) {
    ppMVar1 = Msat_SolverReadWatchedArray(p);
    Msat_ClauseRemoveWatch(ppMVar1[(int)(pC[1].Num ^ 1)],pC);
    Msat_ClauseRemoveWatch(ppMVar1[(int)(*(uint *)&pC[1].field_0x4 ^ 1)],pC);
  }
  p_00 = Msat_SolverReadMem(p);
  Msat_MmStepEntryRecycle(p_00,(char *)pC,*(uint *)&pC->field_0x4 >> 0x11);
  return;
}

Assistant:

void Msat_ClauseFree( Msat_Solver_t * p, Msat_Clause_t * pC, int  fRemoveWatched )
{
    if ( fRemoveWatched )
    {
        Msat_Lit_t Lit;
        Msat_ClauseVec_t ** pvWatched;
        pvWatched = Msat_SolverReadWatchedArray( p );
        Lit = MSAT_LITNOT( pC->pData[0] );
        Msat_ClauseRemoveWatch( pvWatched[Lit], pC );
        Lit = MSAT_LITNOT( pC->pData[1] );
        Msat_ClauseRemoveWatch( pvWatched[Lit], pC ); 
    }

#ifdef USE_SYSTEM_MEMORY_MANAGEMENT
    ABC_FREE( pC );
#else
    Msat_MmStepEntryRecycle( Msat_SolverReadMem(p), (char *)pC, pC->nSizeAlloc );
#endif

}